

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O1

FUNCTION_RETURN generate_disk_pc_id(PcIdentifier *identifiers,uint *num_identifiers,_Bool use_label)

{
  PcIdentifier *__dest;
  bool bVar1;
  FUNCTION_RETURN FVar2;
  ulong in_RAX;
  DiskInfo *diskInfos;
  ulong uVar3;
  uchar *puVar4;
  uint uVar5;
  size_t __size;
  uchar *puVar6;
  ulong uVar7;
  ulong uVar8;
  size_t disk_num;
  ulong local_38;
  
  local_38 = in_RAX;
  FVar2 = getDiskInfos((DiskInfo *)0x0,&local_38);
  if (FVar2 == FUNC_RET_OK) {
    __size = local_38 * 0x20c;
    diskInfos = (DiskInfo *)malloc(__size);
    memset(diskInfos,0,__size);
    FVar2 = getDiskInfos(diskInfos,&local_38);
    if (FVar2 == FUNC_RET_OK) {
      FVar2 = FUNC_RET_OK;
      if (local_38 == 0) {
        uVar3 = 0;
      }
      else {
        puVar4 = diskInfos->disk_sn;
        uVar5 = 1;
        uVar3 = 0;
        do {
          puVar6 = puVar4 + 8;
          if (!use_label) {
            puVar6 = puVar4;
          }
          uVar3 = (uVar3 + 1) - (ulong)(*puVar6 == '\0');
          uVar7 = (ulong)uVar5;
          puVar4 = puVar4 + 0x20c;
          uVar5 = uVar5 + 1;
        } while (uVar7 < local_38);
      }
      uVar5 = *num_identifiers;
      *num_identifiers = (uint)uVar3;
      if (((identifiers != (PcIdentifier *)0x0) &&
          (FVar2 = FUNC_RET_BUFFER_TOO_SMALL, uVar3 <= (ulong)(long)(int)uVar5)) &&
         (FVar2 = FUNC_RET_OK, local_38 != 0)) {
        uVar8 = 0;
        uVar3 = 0;
        uVar7 = 1;
        do {
          if (use_label) {
            if (diskInfos[uVar3].label[0] != '\0') {
              __dest = identifiers + uVar8;
              *(uchar *)((long)__dest + 4) = '\0';
              *(uchar *)((long)__dest + 5) = '\0';
              *(uchar *)((long)__dest + 0) = '\0';
              *(uchar *)((long)__dest + 1) = '\0';
              *(uchar *)((long)__dest + 2) = '\0';
              *(uchar *)((long)__dest + 3) = '\0';
              strncpy((char *)__dest,diskInfos[uVar3].label,6);
LAB_002c9b16:
              uVar8 = (ulong)((int)uVar8 + 1);
            }
          }
          else if (diskInfos[uVar3].disk_sn[0] != '\0') {
            *(undefined2 *)(identifiers[uVar8] + 4) = *(undefined2 *)(diskInfos[uVar3].disk_sn + 6);
            *(undefined4 *)identifiers[uVar8] = *(undefined4 *)(diskInfos[uVar3].disk_sn + 2);
            goto LAB_002c9b16;
          }
          bVar1 = uVar7 < local_38;
          uVar3 = uVar7;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (bVar1);
        FVar2 = FUNC_RET_OK;
      }
    }
    free(diskInfos);
  }
  return FVar2;
}

Assistant:

static FUNCTION_RETURN generate_disk_pc_id(PcIdentifier * identifiers,
		unsigned int * num_identifiers, bool use_label) {
	size_t disk_num, available_disk_info = 0;
	FUNCTION_RETURN result_diskinfos;
	unsigned int i, j;
	int defined_identifiers;
	char firstChar;
	DiskInfo * diskInfos;

	result_diskinfos = getDiskInfos(NULL, &disk_num);
	if (result_diskinfos != FUNC_RET_OK) {
		return result_diskinfos;
	}
	diskInfos = (DiskInfo*) malloc(disk_num * sizeof(DiskInfo));
	memset(diskInfos,0,disk_num * sizeof(DiskInfo));
	result_diskinfos = getDiskInfos(diskInfos, &disk_num);
	if (result_diskinfos != FUNC_RET_OK) {
		free(diskInfos);
		return result_diskinfos;
	}
	for (i = 0; i < disk_num; i++) {
		firstChar = use_label ? diskInfos[i].label[0] : diskInfos[i].disk_sn[0];
		available_disk_info += firstChar == 0 ? 0 : 1;
	}

	defined_identifiers = *num_identifiers;
	*num_identifiers = available_disk_info;
	if (identifiers == NULL) {
		free(diskInfos);
		return FUNC_RET_OK;
	} else if (available_disk_info > defined_identifiers) {
		free(diskInfos);
		return FUNC_RET_BUFFER_TOO_SMALL;
	}

	j = 0;
	for (i = 0; i < disk_num; i++) {
		if (use_label) {
			if (diskInfos[i].label[0] != 0) {
				memset(identifiers[j], 0, sizeof(PcIdentifier)); //!!!!!!!
				strncpy((char*)identifiers[j], diskInfos[i].label,
						sizeof(PcIdentifier));
				j++;
			}
		} else {
			if (diskInfos[i].disk_sn[0] != 0) {
				memcpy(identifiers[j], &diskInfos[i].disk_sn[2],
						sizeof(PcIdentifier));
				j++;
			}
		}
	}
	free(diskInfos);
	return FUNC_RET_OK;
}